

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QMdiSubWindow::showShaded(QMdiSubWindow *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar5;
  Representation RVar6;
  Representation RVar7;
  Representation RVar8;
  bool bVar9;
  QWidget *pQVar10;
  QSize QVar11;
  short sVar12;
  
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if ((*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) ||
     ((this_00->isShadeRequestFromMinimizeMode == false && (this_00->isShadeMode != false)))) {
    return;
  }
  this_00->isMaximizeMode = false;
  QMdiSubWindowPrivate::storeFocusWidget(this_00);
  if (this_00->isShadeRequestFromMinimizeMode == false) {
    this_00->isShadeMode = true;
    QMdiSubWindowPrivate::ensureWindowState(this_00,WindowMinimized);
  }
  QMdiSubWindowPrivate::removeButtonsFromMenuBar(this_00);
  bVar9 = QWidget::hasFocus(&this->super_QWidget);
  if (!bVar9) {
    pQVar10 = QApplication::focusWidget();
    bVar9 = QWidget::isAncestorOf(&this->super_QWidget,pQVar10);
    if (!bVar9) goto LAB_0041894a;
  }
  QMdiSubWindowPrivate::ensureWindowState(this_00,WindowActive);
LAB_0041894a:
  QMdiSubWindowPrivate::setSizeGripVisible(this_00,false);
  if ((((this_00->restoreSize).wd.m_i < 0) || ((this_00->restoreSize).ht.m_i < 0)) ||
     (this_00->isShadeMode == true)) {
    pQVar5 = (this->super_QWidget).data;
    RVar6.m_i = (pQVar5->crect).y1.m_i;
    RVar7.m_i = (pQVar5->crect).x2.m_i;
    RVar8.m_i = (pQVar5->crect).y2.m_i;
    (this_00->oldGeometry).x1 = (Representation)(pQVar5->crect).x1.m_i;
    (this_00->oldGeometry).y1 = (Representation)RVar6.m_i;
    (this_00->oldGeometry).x2 = (Representation)RVar7.m_i;
    (this_00->oldGeometry).y2 = (Representation)RVar8.m_i;
    uVar1 = (this_00->oldGeometry).x2;
    uVar3 = (this_00->oldGeometry).y2;
    uVar2 = (this_00->oldGeometry).x1;
    uVar4 = (this_00->oldGeometry).y1;
    QVar11.wd.m_i = (uVar1 - uVar2) + 1;
    QVar11.ht.m_i = (uVar3 - uVar4) + 1;
    this_00->restoreSize = QVar11;
  }
  sVar12 = (short)((this->super_QWidget).data)->widget_attributes;
  if (sVar12 < 0) {
    (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,0);
  }
  QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
  QVar11 = QWidget::minimumSize(&this->super_QWidget);
  if (QVar11 != (QSize)0x0) {
    QVar11 = QWidget::minimumSize(&this->super_QWidget);
    this_00->userMinimumSize = QVar11;
    QWidget::setMinimumSize(&this->super_QWidget,&this_00->internalMinimumSize);
  }
  QWidget::resize(&this->super_QWidget,&this_00->internalMinimumSize);
  bVar9 = QPointer::operator_cast_to_bool((QPointer *)&this_00->baseWidget);
  if (((bVar9) &&
      (pQVar10 = (QWidget *)(this_00->baseWidget).wp.value,
      (pQVar10->data->widget_attributes & 0x10000) == 0)) &&
     (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)) {
    QWidget::hide(pQVar10);
    this_00->isWidgetHiddenByUs = true;
  }
  if (sVar12 < 0) {
    (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,1);
  }
  QMdiSubWindowPrivate::setFocusWidget(this_00);
  this_00->resizeEnabled = false;
  this_00->moveEnabled = true;
  QMdiSubWindowPrivate::updateDirtyRegions(this_00);
  QMdiSubWindowPrivate::updateMask(this_00);
  QMdiSubWindowPrivate::setEnabled(this_00,MinimizeAction,false);
  QMdiSubWindowPrivate::setEnabled(this_00,ResizeAction,this_00->resizeEnabled);
  QMdiSubWindowPrivate::setEnabled(this_00,MaximizeAction,true);
  QMdiSubWindowPrivate::setEnabled(this_00,RestoreAction,true);
  QMdiSubWindowPrivate::setEnabled(this_00,MoveAction,this_00->moveEnabled);
  return;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }